

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_ObjAddFanins(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFanins)

{
  ushort uVar1;
  uint uVar2;
  int *piVar3;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *__dest;
  
  if (pObj->nFanins != 0) {
    __assert_fail("pObj->nFanins == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcNtk.c"
                  ,0xc4,"void Wlc_ObjAddFanins(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Int_t *)");
  }
  uVar2 = vFanins->nSize;
  pObj->nFanins = uVar2;
  if ((2 < uVar2) ||
     ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) == (undefined1  [24])0x6)
     ) {
    piVar3 = (int *)Mem_FlexEntryFetch(p->pMemFanin,uVar2 << 2);
    (pObj->field_9).pFanins[0] = piVar3;
  }
  if ((pObj->nFanins < 3) &&
     ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) != (undefined1  [24])0x6)
     ) {
    __dest = &pObj->field_9;
  }
  else {
    __dest = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)(pObj->field_9).pFanins[0];
  }
  memcpy(__dest,vFanins->pArray,(long)vFanins->nSize << 2);
  uVar1 = *(ushort *)pObj & 0x3f;
  if (uVar1 == 6) {
    uVar2 = 0;
  }
  else {
    if ((uVar1 != 0x35) && (uVar1 != 0x16)) {
      return;
    }
    uVar2 = 1;
  }
  pObj->nFanins = uVar2;
  return;
}

Assistant:

void Wlc_ObjAddFanins( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFanins )
{
    assert( pObj->nFanins == 0 );
    pObj->nFanins = Vec_IntSize(vFanins);
    if ( Wlc_ObjHasArray(pObj) )
        pObj->pFanins[0] = (int *)Mem_FlexEntryFetch( p->pMemFanin, Vec_IntSize(vFanins) * sizeof(int) );
    memcpy( Wlc_ObjFanins(pObj), Vec_IntArray(vFanins), sizeof(int) * Vec_IntSize(vFanins) );
    // special treatment of CONST, SELECT and TABLE
    if ( pObj->Type == WLC_OBJ_CONST )
        pObj->nFanins = 0;
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT || pObj->Type == WLC_OBJ_TABLE )
        pObj->nFanins = 1;
}